

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * MyGame_Example_Any_parse_json_union
                 (flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t type,
                 flatcc_builder_ref_t *result)

{
  int iVar1;
  uint64_t uVar2;
  char *buf_00;
  uint8_t *puVar3;
  char *pcVar4;
  undefined7 in_register_00000009;
  uint8_t uVar5;
  flatcc_builder_t *B;
  int iStack_60;
  uint8_t val_2;
  uint8_t local_4b;
  int8_t val_1;
  int8_t val;
  int *local_48;
  int more;
  int local_3c;
  ulong local_38;
  
  *result = 0;
  switch(CONCAT71(in_register_00000009,type) & 0xffffffff) {
  case 0:
    pcVar4 = flatcc_json_parser_none(ctx,buf,end);
    return pcVar4;
  case 1:
    buf = MyGame_Example_Monster_parse_json_table(ctx,buf,end,result);
    break;
  case 2:
    *result = 0;
    iVar1 = flatcc_builder_start_table(ctx->ctx,4);
    if (iVar1 == 0) {
      local_48 = result;
      buf = flatcc_json_parser_object_start(ctx,buf,end,&more);
      local_38 = 0x636f6c6f72320000;
      while (more != 0) {
        pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
        uVar2 = flatcc_json_parser_symbol_part(pcVar4,end);
        if ((uVar2 & 0xffffffffffff0000) == local_38) {
          buf_00 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,6);
          if (pcVar4 == buf_00) {
LAB_0010d61e:
            if ((uint)(uVar2 >> 0x28) == 0x756332) {
              pcVar4 = flatcc_json_parser_match_symbol(ctx,buf_00,end,3);
              if (buf_00 == pcVar4) {
LAB_0010d774:
                buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
                goto LAB_0010d77f;
              }
              val_2 = '\0';
              buf = flatcc_json_parser_uint8(ctx,pcVar4,end,&val_2);
              if ((pcVar4 == buf) &&
                 ((buf = flatcc_json_parser_symbolic_uint8
                                   (ctx,buf,end,
                                    (flatcc_json_parser_integral_symbol_f **)
                                    MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_214
                                    ,&val_2), result = local_48, buf == pcVar4 || (buf == end))))
              goto LAB_0010d86f;
              if ((val_2 == '\x02') && ((ctx->flags & 2) == 0)) goto LAB_0010d77f;
              B = ctx->ctx;
              iVar1 = 3;
              uVar5 = val_2;
            }
            else {
              pcVar4 = buf_00;
              if (((short)(uVar2 >> 0x30) != 0x7563) ||
                 (pcVar4 = flatcc_json_parser_match_symbol(ctx,buf_00,end,2), buf_00 == pcVar4))
              goto LAB_0010d774;
              local_4b = '\0';
              buf = flatcc_json_parser_uint8(ctx,pcVar4,end,&local_4b);
              if ((pcVar4 == buf) &&
                 ((buf = flatcc_json_parser_symbolic_uint8
                                   (ctx,buf,end,
                                    (flatcc_json_parser_integral_symbol_f **)
                                    MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_215
                                    ,&local_4b), result = local_48, buf == pcVar4 || (buf == end))))
              goto LAB_0010d86f;
              if ((local_4b == '\x02') && ((ctx->flags & 2) == 0)) goto LAB_0010d77f;
              B = ctx->ctx;
              iVar1 = 2;
              uVar5 = local_4b;
            }
          }
          else {
            val = '\0';
            buf = flatcc_json_parser_int8(ctx,buf_00,end,&val);
            if ((buf_00 == buf) &&
               ((buf = flatcc_json_parser_symbolic_int8
                                 (ctx,buf,end,
                                  (flatcc_json_parser_integral_symbol_f **)
                                  MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers
                                  ,&val), result = local_48, buf == buf_00 || (buf == end))))
            goto LAB_0010d86f;
            if ((val == '\x02') && ((ctx->flags & 2) == 0)) goto LAB_0010d77f;
            B = ctx->ctx;
            iVar1 = 1;
            uVar5 = val;
          }
LAB_0010d756:
          puVar3 = (uint8_t *)flatcc_builder_table_add(B,iVar1,1,1);
          result = local_48;
          if (puVar3 == (uint8_t *)0x0) goto LAB_0010d86f;
          *puVar3 = uVar5;
        }
        else {
          buf_00 = pcVar4;
          if (((uVar2 & 0xffffffffff000000) != 0x636f6c6f72000000) ||
             (buf_00 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,5), pcVar4 == buf_00))
          goto LAB_0010d61e;
          val_1 = '\0';
          buf = flatcc_json_parser_int8(ctx,buf_00,end,&val_1);
          if ((buf_00 == buf) &&
             ((buf = flatcc_json_parser_symbolic_int8
                               (ctx,buf,end,
                                (flatcc_json_parser_integral_symbol_f **)
                                MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_213
                                ,&val_1), result = local_48, buf == buf_00 || (buf == end))))
          goto LAB_0010d86f;
          if ((val_1 != '\x02') || ((ctx->flags & 2) != 0)) {
            B = ctx->ctx;
            iVar1 = 0;
            uVar5 = val_1;
            goto LAB_0010d756;
          }
        }
LAB_0010d77f:
        buf = flatcc_json_parser_object_end(ctx,buf,end,&more);
      }
      result = local_48;
      if (ctx->error == 0) {
        iVar1 = flatcc_builder_end_table(ctx->ctx);
        result = local_48;
LAB_0010d868:
        *result = iVar1;
        if (iVar1 != 0) break;
      }
    }
    goto LAB_0010d86f;
  case 3:
    *result = 0;
    iVar1 = flatcc_builder_start_table(ctx->ctx,0);
    if (iVar1 == 0) {
      buf = flatcc_json_parser_object_start(ctx,buf,end,&local_3c);
      while (local_3c != 0) {
        pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
        pcVar4 = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
        buf = flatcc_json_parser_object_end(ctx,pcVar4,end,&local_3c);
      }
      if (ctx->error == 0) {
        iVar1 = flatcc_builder_end_table(ctx->ctx);
        goto LAB_0010d868;
      }
    }
LAB_0010d86f:
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
    break;
  case 4:
    buf = MyGame_Example_Alt_parse_json_table(ctx,buf,end,result);
    break;
  default:
    if ((ctx->flags & 1) != 0) {
      pcVar4 = flatcc_json_parser_generic_json(ctx,buf,end);
      return pcVar4;
    }
    iStack_60 = 0xf;
    goto LAB_0010d8a4;
  }
  if ((ctx->error != 0) || (*result != 0)) {
    return buf;
  }
  iStack_60 = 0x23;
LAB_0010d8a4:
  pcVar4 = flatcc_json_parser_set_error(ctx,buf,end,iStack_60);
  return pcVar4;
}

Assistant:

static const char *MyGame_Example_Any_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)
{

    *result = 0;
    switch (type) {
    case 0: /* NONE */
        return flatcc_json_parser_none(ctx, buf, end);
    case 1: /* Monster */
        buf = MyGame_Example_Monster_parse_json_table(ctx, buf, end, result);
        break;
    case 2: /* TestSimpleTableWithEnum */
        buf = MyGame_Example_TestSimpleTableWithEnum_parse_json_table(ctx, buf, end, result);
        break;
    case 3: /* Monster2 */
        buf = MyGame_Example2_Monster_parse_json_table(ctx, buf, end, result);
        break;
    case 4: /* Alt */
        buf = MyGame_Example_Alt_parse_json_table(ctx, buf, end, result);
        break;
    default:
        if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
        } else {
            return flatcc_json_parser_generic_json(ctx, buf, end);
        }
    }
    if (ctx->error) return buf;
    if (!*result) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
    }
    return buf;
}